

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolAccess.cpp
# Opt level: O1

int __thiscall bhf::ads::SymbolAccess::ShowSymbols(SymbolAccess *this,ostream *os)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
  _Stack_48;
  
  FetchSymbolEntries_abi_cxx11_((SymbolEntryMap *)&_Stack_48,this);
  for (; (_Rb_tree_header *)_Stack_48._M_impl.super__Rb_tree_header._M_header._M_left !=
         &_Stack_48._M_impl.super__Rb_tree_header;
      _Stack_48._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           std::_Rb_tree_increment(_Stack_48._M_impl.super__Rb_tree_header._M_header._M_left)) {
    SymbolEntry::WriteAsJSON
              ((SymbolEntry *)(_Stack_48._M_impl.super__Rb_tree_header._M_header._M_left + 2),os);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
  ::~_Rb_tree(&_Stack_48);
  return 0;
}

Assistant:

int SymbolAccess::ShowSymbols(std::ostream& os) const
{
    for (const auto& entry: FetchSymbolEntries()) {
        entry.second.WriteAsJSON(os);
    }
    return 0;
}